

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O2

void sexp_mark_one(sexp_conflict ctx,sexp_conflict *types,sexp_conflict x)

{
  sexp_mark_stack_ptr_t *psVar1;
  sexp_mark_stack_ptr_t **ppsVar2;
  sexp_gc_var_t *psVar3;
  sexp_conflict psVar4;
  sexp_mark_stack_ptr_t *psVar5;
  uint uVar6;
  sexp_mark_stack_ptr_t *psVar7;
  long lVar8;
  sexp_mark_stack_ptr_t **ptr;
  sexp_conflict *ppsVar9;
  sexp_gc_var_t **ppsVar10;
  sexp_conflict *ppsVar11;
  sexp_conflict *ppsVar12;
  
  psVar1 = (ctx->value).context.mark_stack;
  ppsVar2 = &(ctx->value).context.mark_stack_ptr;
  do {
    if (((x == (sexp_conflict)0x0) || (((ulong)x & 3) != 0)) || (x->markedp != '\0')) {
      return;
    }
    x->markedp = '\x01';
    uVar6 = x->tag;
    if (uVar6 == 0x24) {
      ppsVar10 = &(x->value).context.saves;
      while (psVar3 = *ppsVar10, psVar3 != (sexp_gc_var_t *)0x0) {
        if (psVar3->var != (sexp_conflict *)0x0) {
          sexp_mark_one(ctx,types,*psVar3->var);
        }
        ppsVar10 = &psVar3->next;
      }
      uVar6 = x->tag;
    }
    psVar4 = types[uVar6];
    lVar8 = (long)(psVar4->value).type.field_len_base +
            (ulong)(psVar4->value).type.field_len_scale *
            *(long *)((long)&x->tag + (long)(psVar4->value).type.field_len_off) + -1;
    if (lVar8 < 0) {
      return;
    }
    ppsVar9 = (sexp_conflict *)((long)&x->tag + (long)(psVar4->value).type.field_base);
    for (ppsVar11 = ppsVar9 + lVar8;
        (ppsVar9 < ppsVar11 &&
        ((psVar4 = *ppsVar11, ((ulong)psVar4 & 3) != 0 || psVar4 == (sexp_conflict)0x0 ||
         (psVar4->markedp != '\0')))); ppsVar11 = ppsVar11 + -1) {
    }
    do {
      ppsVar12 = ppsVar11;
      if (ppsVar12 <= ppsVar9) goto LAB_0010cdc1;
      ppsVar11 = ppsVar12 + -1;
    } while (*ppsVar12 == ppsVar12[-1]);
    psVar5 = *ppsVar2;
    psVar7 = psVar1;
    if ((psVar5 != (sexp_mark_stack_ptr_t *)0x0) &&
       (psVar7 = psVar5 + 1, psVar5 < psVar1 || ppsVar2 <= psVar7)) {
      psVar7 = (sexp_mark_stack_ptr_t *)malloc(0x18);
    }
    *ppsVar2 = psVar7;
    psVar7->start = ppsVar9;
    (*ppsVar2)->end = ppsVar12;
    (*ppsVar2)->prev = psVar5;
LAB_0010cdc1:
    x = *ppsVar12;
  } while( true );
}

Assistant:

static void sexp_mark_one (sexp ctx, sexp* types, sexp x) {
  sexp_sint_t len;
  sexp t, *p, *q;
  struct sexp_gc_var_t *saves;
 loop:
  if (!x || !sexp_pointerp(x) || !sexp_valid_object_p(ctx, x) || sexp_markedp(x))
    return;
  sexp_markedp(x) = 1;
  if (sexp_contextp(x)) {
    for (saves=sexp_context_saves(x); saves; saves=saves->next)
      if (saves->var) sexp_mark_one(ctx, types, *(saves->var));
  }
  t = types[sexp_pointer_tag(x)];
  len = sexp_type_num_slots_of_object(t, x) - 1;
  if (len >= 0) {
    p = (sexp*) (((char*)x) + sexp_type_field_base(t));
    q = p + len;
    while (p < q && (*q && sexp_pointerp(*q) ? sexp_markedp(*q) : 1))
      q--;                      /* skip trailing immediates */
    while (p < q && *q == q[-1])
      q--;                      /* skip trailing duplicates */
    if (p < q) {
      sexp_mark_stack_push(ctx, p, q);
    }
    x = *q;
    goto loop;
  }
}